

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CheckerInstanceBodySymbol::CheckerInstanceBodySymbol
          (CheckerInstanceBodySymbol *this,Compilation *compilation,CheckerSymbol *checker,
          AssertionInstanceDetails *assertionDetails,ASTContext *originalContext,
          uint32_t instanceDepth,bool isProcedural,bitmask<slang::ast::InstanceFlags> flags)

{
  SymbolIndex SVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  underlying_type uVar5;
  Symbol *pSVar6;
  TempVarSymbol *pTVar7;
  RandomizeDetails *pRVar8;
  undefined4 uVar9;
  
  sVar3 = (checker->super_Symbol).name._M_len;
  pcVar4 = (checker->super_Symbol).name._M_str;
  SVar2 = (checker->super_Symbol).location;
  (this->super_Symbol).kind = CheckerInstanceBody;
  (this->super_Symbol).name._M_len = sVar3;
  (this->super_Symbol).name._M_str = pcVar4;
  (this->super_Symbol).location = SVar2;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->parentInstance = (CheckerInstanceSymbol *)0x0;
  this->checker = checker;
  this->assertionDetails = assertionDetails;
  this->instanceDepth = instanceDepth;
  this->isProcedural = isProcedural;
  (this->flags).m_bits = flags.m_bits;
  SVar1 = originalContext->lookupIndex;
  uVar9 = *(undefined4 *)&originalContext->field_0xc;
  uVar5 = (originalContext->flags).m_bits;
  pSVar6 = originalContext->instanceOrProc;
  pTVar7 = originalContext->firstTempVar;
  pRVar8 = originalContext->randomizeDetails;
  (this->originalContext).scope.ptr = (originalContext->scope).ptr;
  (this->originalContext).lookupIndex = SVar1;
  *(undefined4 *)&(this->originalContext).field_0xc = uVar9;
  (this->originalContext).flags.m_bits = uVar5;
  (this->originalContext).instanceOrProc = pSVar6;
  (this->originalContext).firstTempVar = pTVar7;
  (this->originalContext).randomizeDetails = pRVar8;
  (this->originalContext).assertionInstance = originalContext->assertionInstance;
  assertionDetails->prevContext = &this->originalContext;
  SVar1 = (checker->super_Symbol).indexInScope;
  (this->super_Symbol).parentScope = (checker->super_Symbol).parentScope;
  (this->super_Symbol).indexInScope = SVar1;
  return;
}

Assistant:

CheckerInstanceBodySymbol::CheckerInstanceBodySymbol(Compilation& compilation,
                                                     const CheckerSymbol& checker,
                                                     AssertionInstanceDetails& assertionDetails,
                                                     const ASTContext& originalContext,
                                                     uint32_t instanceDepth, bool isProcedural,
                                                     bitmask<InstanceFlags> flags) :
    Symbol(SymbolKind::CheckerInstanceBody, checker.name, checker.location),
    Scope(compilation, this), checker(checker), assertionDetails(assertionDetails),
    instanceDepth(instanceDepth), isProcedural(isProcedural), flags(flags),
    originalContext(originalContext) {

    assertionDetails.prevContext = &this->originalContext;

    auto parent = checker.getParentScope();
    SLANG_ASSERT(parent);
    setParent(*parent, checker.getIndex());
}